

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::TransactionAddedToMempool
          (ValidationSignals *this,NewMempoolTransactionInfo *tx,uint64_t mempool_sequence)

{
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  _func_void *p_Var3;
  NewMempoolTransactionInfo *pNVar4;
  anon_class_64_3_5d17f6a9_for_event *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  char *local_name;
  anon_class_64_3_5d17f6a9_for_event event;
  undefined1 local_c0 [56];
  NewMempoolTransactionInfo local_88;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &event;
  pNVar4 = tx;
  NewMempoolTransactionInfo::NewMempoolTransactionInfo(&this_00->tx,tx);
  local_name = "TransactionAddedToMempool";
  event.mempool_sequence = mempool_sequence;
  event.this = this;
  bVar2 = ::LogAcceptCategory((LogFlags)this_00,(Level)pNVar4);
  local_c0._0_8_ = "TransactionAddedToMempool";
  if (bVar2) {
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)local_c0,
               (base_blob<256u> *)
               &((tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_48,
               (base_blob<256u> *)
               &((tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_witness_hash);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    logging_function._M_str = "TransactionAddedToMempool";
    logging_function._M_len = 0x19;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,199,VALIDATION,Debug,(ConstevalFormatString<3U>)0xcd686b
               ,&local_name,(string *)local_c0,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)local_c0);
    local_c0._0_8_ = local_name;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  NewMempoolTransactionInfo::NewMempoolTransactionInfo
            ((NewMempoolTransactionInfo *)(local_c0 + 8),tx);
  TransactionAddedToMempool(NewMempoolTransactionInfo_const&,unsigned_long)::$_1::__1
            ((__1 *)&local_88,&event);
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  p_Var3 = (_func_void *)operator_new(0x78);
  *(undefined8 *)p_Var3 = local_c0._0_8_;
  NewMempoolTransactionInfo::NewMempoolTransactionInfo
            ((NewMempoolTransactionInfo *)(p_Var3 + 8),(NewMempoolTransactionInfo *)(local_c0 + 8));
  NewMempoolTransactionInfo::NewMempoolTransactionInfo
            ((NewMempoolTransactionInfo *)(p_Var3 + 0x38),&local_88);
  *(undefined4 *)(p_Var3 + 0x68) = local_58;
  *(undefined4 *)(p_Var3 + 0x6c) = uStack_54;
  *(undefined4 *)(p_Var3 + 0x70) = uStack_50;
  *(undefined4 *)(p_Var3 + 0x74) = uStack_4c;
  pcStack_110 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:197:5)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:197:5)>
              ::_M_manager;
  local_128._M_unused._0_8_ = (undefined8)p_Var3;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  TransactionAddedToMempool(NewMempoolTransactionInfo_const&,unsigned_long)::$_0::~__0
            ((__0 *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&event.tx.info.m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::TransactionAddedToMempool(const NewMempoolTransactionInfo& tx, uint64_t mempool_sequence)
{
    auto event = [tx, mempool_sequence, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.TransactionAddedToMempool(tx, mempool_sequence); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: txid=%s wtxid=%s", __func__,
                          tx.info.m_tx->GetHash().ToString(),
                          tx.info.m_tx->GetWitnessHash().ToString());
}